

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asm-utf8check.cpp
# Opt level: O0

bool arangodb::velocypack::validate_utf8_fast_sse42(uint8_t *src,size_t len)

{
  __m128i current_bytes_00;
  __m128i current_bytes_01;
  undefined1 auVar1 [16];
  ulong in_RSI;
  long in_RDI;
  __m128i current_bytes_1;
  char buffer [16];
  __m128i current_bytes;
  processed_utf_bytes previous;
  __m128i has_error;
  size_t i;
  undefined1 local_208 [24];
  __m128i *in_stack_fffffffffffffe10;
  processed_utf_bytes *in_stack_fffffffffffffe18;
  longlong in_stack_fffffffffffffe20;
  longlong in_stack_fffffffffffffe28;
  longlong local_1c8 [2];
  undefined1 local_1b8 [48];
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  ulong local_148;
  ulong uStack_140;
  ulong local_130;
  ulong local_128;
  long local_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  longlong *local_d8;
  undefined8 *local_d0;
  char local_98;
  char cStack_97;
  char cStack_96;
  char cStack_95;
  char cStack_94;
  char cStack_93;
  char cStack_92;
  char cStack_91;
  char cStack_90;
  char cStack_8f;
  char cStack_8e;
  char cStack_8d;
  char cStack_8c;
  char cStack_8b;
  char cStack_8a;
  char cStack_89;
  
  local_130 = 0;
  local_e8 = 0;
  uStack_e0 = 0;
  local_148 = 0;
  uStack_140 = 0;
  local_f8 = 0;
  uStack_f0 = 0;
  local_178 = 0;
  uStack_170 = 0;
  local_108 = 0;
  uStack_100 = 0;
  local_168 = 0;
  uStack_160 = 0;
  local_118 = 0;
  uStack_110 = 0;
  local_158 = 0;
  uStack_150 = 0;
  local_128 = in_RSI;
  local_120 = in_RDI;
  if (0xf < in_RSI) {
    for (; local_130 <= local_128 - 0x10; local_130 = local_130 + 0x10) {
      local_d0 = (undefined8 *)(local_120 + local_130);
      local_188 = *local_d0;
      uStack_180 = local_d0[1];
      current_bytes_00[1] = in_stack_fffffffffffffe28;
      current_bytes_00[0] = in_stack_fffffffffffffe20;
      checkUTF8Bytes(current_bytes_00,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
      memcpy(&local_178,local_1b8,0x30);
    }
  }
  if (local_130 < local_128) {
    memset(local_1c8,0,0x10);
    memcpy(local_1c8,(void *)(local_120 + local_130),local_128 - local_130);
    local_d8 = local_1c8;
    current_bytes_01[1] = local_1c8[0];
    current_bytes_01[0] = in_stack_fffffffffffffe20;
    checkUTF8Bytes(current_bytes_01,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
    memcpy(&local_178,local_208,0x30);
  }
  else {
    local_98 = (char)local_158;
    cStack_97 = (char)((ulong)local_158 >> 8);
    cStack_96 = (char)((ulong)local_158 >> 0x10);
    cStack_95 = (char)((ulong)local_158 >> 0x18);
    cStack_94 = (char)((ulong)local_158 >> 0x20);
    cStack_93 = (char)((ulong)local_158 >> 0x28);
    cStack_92 = (char)((ulong)local_158 >> 0x30);
    cStack_91 = (char)((ulong)local_158 >> 0x38);
    cStack_90 = (char)uStack_150;
    cStack_8f = (char)((ulong)uStack_150 >> 8);
    cStack_8e = (char)((ulong)uStack_150 >> 0x10);
    cStack_8d = (char)((ulong)uStack_150 >> 0x18);
    cStack_8c = (char)((ulong)uStack_150 >> 0x20);
    cStack_8b = (char)((ulong)uStack_150 >> 0x28);
    cStack_8a = (char)((ulong)uStack_150 >> 0x30);
    cStack_89 = (char)((ulong)uStack_150 >> 0x38);
    local_148 = CONCAT17(-('\t' < cStack_91),
                         CONCAT16(-('\t' < cStack_92),
                                  CONCAT15(-('\t' < cStack_93),
                                           CONCAT14(-('\t' < cStack_94),
                                                    CONCAT13(-('\t' < cStack_95),
                                                             CONCAT12(-('\t' < cStack_96),
                                                                      CONCAT11(-('\t' < cStack_97),
                                                                               -('\t' < local_98))))
                                                   )))) | local_148;
    uStack_140 = CONCAT17(-('\x01' < cStack_89),
                          CONCAT16(-('\t' < cStack_8a),
                                   CONCAT15(-('\t' < cStack_8b),
                                            CONCAT14(-('\t' < cStack_8c),
                                                     CONCAT13(-('\t' < cStack_8d),
                                                              CONCAT12(-('\t' < cStack_8e),
                                                                       CONCAT11(-('\t' < cStack_8f),
                                                                                -('\t' < cStack_90))
                                                                      )))))) | uStack_140;
  }
  auVar1._8_8_ = uStack_140;
  auVar1._0_8_ = local_148;
  return auVar1 == (undefined1  [16])0x0;
}

Assistant:

bool validate_utf8_fast_sse42(uint8_t const* src, std::size_t len) {
  std::size_t i = 0;
  __m128i has_error = _mm_setzero_si128();
  struct processed_utf_bytes previous = {
      .rawbytes = _mm_setzero_si128(),
      .high_nibbles = _mm_setzero_si128(),
      .carried_continuations = _mm_setzero_si128()};
  if (len >= 16) {
    for (; i <= len - 16; i += 16) {
      __m128i current_bytes = _mm_loadu_si128((const __m128i*)(src + i));
      previous = checkUTF8Bytes(current_bytes, &previous, &has_error);
    }
  }

  // last part
  if (i < len) {
    char buffer[16];
    memset(buffer, 0, 16);
    memcpy(buffer, src + i, len - i);
    __m128i current_bytes = _mm_loadu_si128((const __m128i*)(buffer));
    previous = checkUTF8Bytes(current_bytes, &previous, &has_error);
  } else {
    has_error = _mm_or_si128(
        _mm_cmpgt_epi8(
            previous.carried_continuations,
            _mm_setr_epi8(9, 9, 9, 9, 9, 9, 9, 9, 9, 9, 9, 9, 9, 9, 9, 1)),
        has_error);
  }

  return _mm_testz_si128(has_error, has_error);
}